

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O3

Value * __thiscall
duckdb::ParquetElementString<duckdb_parquet::FieldRepetitionType::type_const&>
          (Value *__return_storage_ptr__,duckdb *this,type *value,bool is_set)

{
  LogicalType LStack_48;
  string local_30;
  
  if ((int)value == 0) {
    LogicalType::LogicalType(&LStack_48,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_48);
    LogicalType::~LogicalType(&LStack_48);
  }
  else {
    ConvertParquetElementToString<duckdb_parquet::FieldRepetitionType::type_const&>
              (&local_30,this,value);
    Value::Value(__return_storage_ptr__,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value ParquetElementString(T &&value, bool is_set) {
	if (!is_set) {
		return Value();
	}
	return Value(ConvertParquetElementToString(value));
}